

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O3

string_view __thiscall uWS::HttpRequest::getHeader(HttpRequest *this,string_view lowerCasedHeader)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  Header *pHVar5;
  size_t sVar6;
  string_view sVar7;
  
  bVar1 = BloomFilter::mightHave(&this->bf,lowerCasedHeader);
  sVar3 = this->headers[1].key._M_len;
  sVar6 = 0;
  pcVar4 = (char *)0x0;
  if (sVar3 != 0 && bVar1) {
    pHVar5 = this->headers + 2;
    sVar6 = 0;
    do {
      if (sVar3 == lowerCasedHeader._M_len) {
        iVar2 = strncmp(pHVar5[-1].key._M_str,lowerCasedHeader._M_str,lowerCasedHeader._M_len);
        if (iVar2 == 0) {
          sVar6 = pHVar5[-1].value._M_len;
          pcVar4 = pHVar5[-1].value._M_str;
          goto LAB_0013fb90;
        }
      }
      sVar3 = (pHVar5->key)._M_len;
      pHVar5 = pHVar5 + 1;
    } while (sVar3 != 0);
    pcVar4 = (char *)0x0;
  }
LAB_0013fb90:
  sVar7._M_str = pcVar4;
  sVar7._M_len = sVar6;
  return sVar7;
}

Assistant:

std::string_view getHeader(std::string_view lowerCasedHeader) {
        if (bf.mightHave(lowerCasedHeader)) {
            for (Header *h = headers; (++h)->key.length(); ) {
                if (h->key.length() == lowerCasedHeader.length() && !strncmp(h->key.data(), lowerCasedHeader.data(), lowerCasedHeader.length())) {
                    return h->value;
                }
            }
        }
        return std::string_view(nullptr, 0);
    }